

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

void cmsysProcess_SetPipeNative(cmsysProcess *cp,int prPipe,int *p)

{
  int *local_28;
  int *pPipeNative;
  int *p_local;
  int prPipe_local;
  cmsysProcess *cp_local;
  
  if (cp != (cmsysProcess *)0x0) {
    if (prPipe == 1) {
      local_28 = cp->PipeNativeSTDIN;
    }
    else if (prPipe == 2) {
      local_28 = cp->PipeNativeSTDOUT;
    }
    else {
      if (prPipe != 3) {
        return;
      }
      local_28 = cp->PipeNativeSTDERR;
    }
    if (p == (int *)0x0) {
      *local_28 = -1;
      local_28[1] = -1;
    }
    else {
      *local_28 = *p;
      local_28[1] = p[1];
      cmsysProcess_SetPipeFile(cp,prPipe,(char *)0x0);
      cmsysProcess_SetPipeShared(cp,prPipe,0);
    }
  }
  return;
}

Assistant:

void kwsysProcess_SetPipeNative(kwsysProcess* cp, int prPipe, int p[2])
{
  int* pPipeNative = 0;

  if (!cp) {
    return;
  }

  switch (prPipe) {
    case kwsysProcess_Pipe_STDIN:
      pPipeNative = cp->PipeNativeSTDIN;
      break;
    case kwsysProcess_Pipe_STDOUT:
      pPipeNative = cp->PipeNativeSTDOUT;
      break;
    case kwsysProcess_Pipe_STDERR:
      pPipeNative = cp->PipeNativeSTDERR;
      break;
    default:
      return;
  }

  /* Copy the native pipe descriptors provided.  */
  if (p) {
    pPipeNative[0] = p[0];
    pPipeNative[1] = p[1];
  } else {
    pPipeNative[0] = -1;
    pPipeNative[1] = -1;
  }

  /* If we are using a native pipe, do not share it or redirect it to
     a file.  */
  if (p) {
    kwsysProcess_SetPipeFile(cp, prPipe, 0);
    kwsysProcess_SetPipeShared(cp, prPipe, 0);
  }
}